

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::addSource
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr file)

{
  PathPtr path;
  int iVar1;
  Maybe<const_kj::ReadableDirectory_&> dir;
  Maybe<capnp::compiler::Module_&> module;
  uint64_t id;
  undefined4 extraout_var;
  long lVar2;
  DirPathPair dirPathPair;
  DirPathPair local_70;
  SourceFile local_50;
  
  if (this->compilerConstructed == false) {
    kj::ctor<capnp::compiler::Compiler,capnp::compiler::Compiler::AnnotationFlag&>
              ((Compiler *)&this->compilerSpace,&this->annotationFlag);
    local_70.dir = (ReadableDirectory *)
                   &kj::DestructorOnlyDisposer<capnp::compiler::Compiler>::instance;
    local_70.path.parts.ptr = (String *)&this->compilerSpace;
    kj::Own<capnp::compiler::Compiler>::operator=
              (&this->compiler,(Own<capnp::compiler::Compiler> *)&local_70);
    kj::Own<capnp::compiler::Compiler>::dispose((Own<capnp::compiler::Compiler> *)&local_70);
    this->compilerConstructed = true;
  }
  if (this->addStandardImportPaths == true) {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 0x10) {
      dir = getSourceDirectory(this,(StringPtr)
                                    *(ArrayPtr<const_char> *)
                                     ((long)&addSource::STANDARD_IMPORT_PATHS[0].content.ptr + lVar2
                                     ),false);
      if (dir.ptr != (ReadableDirectory *)0x0) {
        ModuleLoader::addImportPath(&this->loader,dir.ptr);
      }
    }
    this->addStandardImportPaths = false;
  }
  interpretSourceFile(&local_70,this,file);
  path.parts.size_ = local_70.path.parts.size_;
  path.parts.ptr = local_70.path.parts.ptr;
  module = ModuleLoader::loadModule(&this->loader,local_70.dir,path);
  if (module.ptr == (Module *)0x0) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"no such file");
  }
  else {
    id = Compiler::add((this->compiler).ptr,module.ptr);
    Compiler::eagerlyCompile((this->compiler).ptr,id,this->compileEagerness);
    local_50.id = id;
    iVar1 = (*((module.ptr)->super_ErrorReporter)._vptr_ErrorReporter[2])(module.ptr);
    local_50.name.content.ptr = (char *)CONCAT44(extraout_var,iVar1);
    local_50.module = (Module *)module;
    kj::Vector<capnp::compiler::CompilerMain::SourceFile>::
    add<capnp::compiler::CompilerMain::SourceFile>(&this->sourceFiles,&local_50);
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  }
  kj::Array<kj::String>::~Array(&local_70.path.parts);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addSource(kj::StringPtr file) {
    if (!compilerConstructed) {
      compiler = compilerSpace.construct(annotationFlag);
      compilerConstructed = true;
    }

    if (addStandardImportPaths) {
      static constexpr kj::StringPtr STANDARD_IMPORT_PATHS[] = {
        "/usr/local/include"_kj,
        "/usr/include"_kj,
#ifdef CAPNP_INCLUDE_DIR
        KJ_CONCAT(CAPNP_INCLUDE_DIR, _kj),
#endif
      };
      for (auto path: STANDARD_IMPORT_PATHS) {
        KJ_IF_MAYBE(dir, getSourceDirectory(path, false)) {
          loader.addImportPath(*dir);
        } else {
          // ignore standard path that doesn't exist
        }
      }

      addStandardImportPaths = false;
    }

    auto dirPathPair = interpretSourceFile(file);
    KJ_IF_MAYBE(module, loader.loadModule(dirPathPair.dir, dirPathPair.path)) {
      uint64_t id = compiler->add(*module);
      compiler->eagerlyCompile(id, compileEagerness);
      sourceFiles.add(SourceFile { id, module->getSourceName(), &*module });
    } else {
      return "no such file";
    }